

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_body.hpp
# Opt level: O2

void iutest::Test::RecordProperty<char[2]>(string *key,char (*value) [2])

{
  string local_30;
  
  PrintToString<char[2]>(&local_30,value);
  RecordPropertyString(key,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

static void RecordProperty(const ::std::string& key, const T& value)
    {
        RecordPropertyString(key, PrintToString(value));
    }